

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delay_estimator_wrapper.cc
# Opt level: O2

int WebRtc_InitDelayEstimatorFarend(void *handle)

{
  int iVar1;
  
  if (handle == (void *)0x0) {
    iVar1 = -1;
  }
  else {
    WebRtc_InitBinaryDelayEstimatorFarend(*(BinaryDelayEstimatorFarend **)((long)handle + 0x10));
    iVar1 = 0;
    memset(*handle,0,(long)*(int *)((long)handle + 0xc) << 2);
    *(undefined4 *)((long)handle + 8) = 0;
  }
  return iVar1;
}

Assistant:

int WebRtc_InitDelayEstimatorFarend(void* handle) {
  DelayEstimatorFarend* self = (DelayEstimatorFarend*) handle;

  if (self == NULL) {
    return -1;
  }

  // Initialize far-end part of binary delay estimator.
  WebRtc_InitBinaryDelayEstimatorFarend(self->binary_farend);

  // Set averaged far and near end spectra to zero.
  memset(self->mean_far_spectrum, 0,
         sizeof(SpectrumType) * self->spectrum_size);
  // Reset initialization indicators.
  self->far_spectrum_initialized = 0;

  return 0;
}